

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser.cpp
# Opt level: O3

void __thiscall CServerBrowser::RequestImpl(CServerBrowser *this,NETADDR *Addr,CServerEntry *pEntry)

{
  int *piVar1;
  int64 iVar2;
  long in_FS_OFFSET;
  CSendCBData Data;
  CPacker Packer;
  CNetChunk Packet;
  CSendCBData local_8a0;
  CPacker local_888;
  CNetChunk local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_pConfig->m_Debug != 0) {
    net_addr_str(Addr,(char *)&local_68,0x30,1);
    str_format((char *)&local_888,0x100,"requesting server info from %s",&local_68);
    (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
              (this->m_pConsole,2,"client_srvbrowse",&local_888,0);
  }
  CPacker::Reset(&local_888);
  CPacker::AddRaw(&local_888,SERVERBROWSE_GETINFO,8);
  piVar1 = &pEntry->m_CurrentToken;
  if (pEntry == (CServerEntry *)0x0) {
    piVar1 = &this->m_CurrentLanToken;
  }
  CPacker::AddInt(&local_888,*piVar1);
  local_68.m_ClientID = -1;
  local_68.m_Address.type = Addr->type;
  local_68.m_Address.ip[0] = Addr->ip[0];
  local_68.m_Address.ip[1] = Addr->ip[1];
  local_68.m_Address.ip[2] = Addr->ip[2];
  local_68.m_Address.ip[3] = Addr->ip[3];
  local_68.m_Address.ip._4_8_ = *(undefined8 *)(Addr->ip + 4);
  local_68.m_Address._16_8_ = *(undefined8 *)(Addr->ip + 0xc);
  local_68.m_Flags = 2;
  local_68.m_DataSize = (int)local_888.m_pCurrent - (int)&local_888;
  local_8a0.m_pfnCallback = CBFTrackPacket;
  local_8a0.m_pCallbackUser = this;
  local_68.m_pData = &local_888;
  CNetClient::Send(this->m_pNetClient,&local_68,0xffffffff,&local_8a0);
  if (pEntry != (CServerEntry *)0x0) {
    pEntry->m_TrackID = local_8a0.m_TrackID;
    iVar2 = time_get();
    pEntry->m_RequestTime = iVar2;
    pEntry->m_InfoState = 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CServerBrowser::RequestImpl(const NETADDR &Addr, CServerEntry *pEntry)
{
	if(Config()->m_Debug)
	{
		char aAddrStr[NETADDR_MAXSTRSIZE];
		net_addr_str(&Addr, aAddrStr, sizeof(aAddrStr), true);
		char aBuf[256];
		str_format(aBuf, sizeof(aBuf),"requesting server info from %s", aAddrStr);
		m_pConsole->Print(IConsole::OUTPUT_LEVEL_DEBUG, "client_srvbrowse", aBuf);
	}

	CPacker Packer;
	Packer.Reset();
	Packer.AddRaw(SERVERBROWSE_GETINFO, sizeof(SERVERBROWSE_GETINFO));
	Packer.AddInt(pEntry ? pEntry->m_CurrentToken : m_CurrentLanToken);

	CNetChunk Packet;
	Packet.m_ClientID = -1;
	Packet.m_Address = Addr;
	Packet.m_Flags = NETSENDFLAG_CONNLESS;
	Packet.m_DataSize = Packer.Size();
	Packet.m_pData = Packer.Data();
	CSendCBData Data;
	Data.m_pfnCallback = CBFTrackPacket;
	Data.m_pCallbackUser = this;
	m_pNetClient->Send(&Packet, NET_TOKEN_NONE, &Data);

	if(pEntry)
	{
		pEntry->m_TrackID = Data.m_TrackID;
		pEntry->m_RequestTime = time_get();
		pEntry->m_InfoState = CServerEntry::STATE_PENDING;
	}
}